

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::MarkString(ACSStringPool *this,int strnum)

{
  uint *puVar1;
  
  if ((strnum & 0xfff00000U) != 0x7ff00000) {
    __assert_fail("(strnum & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                  ,0x1d0,"void ACSStringPool::MarkString(int)");
  }
  if ((strnum & 0xfffffU) < (this->Pool).Count) {
    puVar1 = &(this->Pool).Array[strnum & 0xfffffU].LockCount;
    *puVar1 = *puVar1 | 0x80000000;
    return;
  }
  __assert_fail("(unsigned)strnum < Pool.Size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                ,0x1d2,"void ACSStringPool::MarkString(int)");
}

Assistant:

void ACSStringPool::MarkString(int strnum)
{
	assert((strnum & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR);
	strnum &= ~LIBRARYID_MASK;
	assert((unsigned)strnum < Pool.Size());
	Pool[strnum].LockCount |= 0x80000000;
}